

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O2

UInt32 crnlib::Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  byte *pbVar3;
  CLzRef *pCVar4;
  bool bVar5;
  UInt32 UVar6;
  ulong uVar7;
  UInt32 *pUVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  UInt32 UVar12;
  ulong uVar13;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  pbVar3 = p->buffer;
  uVar9 = (uint)pbVar3[1] ^ p->crc[*pbVar3];
  uVar10 = (uint)pbVar3[2] << 8 ^ uVar9;
  uVar13 = (ulong)(uVar10 & 0xffff);
  UVar12 = p->pos;
  pCVar4 = p->hash;
  uVar7 = (ulong)((uVar9 & 0x3ff) << 2);
  CVar1 = *(CLzRef *)((long)pCVar4 + uVar7);
  uVar11 = UVar12 - CVar1;
  CVar2 = pCVar4[uVar13 + 0x400];
  uVar9 = ((p->crc[pbVar3[3]] << 5 ^ uVar10) & p->hashMask) + 0x10400;
  UVar6 = pCVar4[uVar9];
  pCVar4[uVar9] = UVar12;
  p->hash[uVar13 + 0x400] = UVar12;
  *(UInt32 *)((long)p->hash + uVar7) = UVar12;
  uVar9 = 1;
  uVar7 = 0;
  bVar5 = true;
  if ((uVar11 < p->cyclicBufferSize) && (pbVar3[-(ulong)uVar11] == *pbVar3)) {
    *distances = 2;
    distances[1] = uVar11 - 1;
    uVar7 = 2;
    bVar5 = false;
    uVar9 = 2;
  }
  if (((CVar2 == CVar1) || (uVar10 = UVar12 - CVar2, p->cyclicBufferSize <= uVar10)) ||
     (pbVar3[-(ulong)uVar10] != *pbVar3)) {
    if (bVar5) {
      uVar7 = 0;
LAB_0018b686:
      UVar12 = 3;
      if (3 < uVar9) {
        UVar12 = uVar9;
      }
      pUVar8 = GetMatchesSpec1(lenLimit,UVar6,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                               p->cyclicBufferSize,p->cutValue,distances + uVar7,UVar12);
      UVar12 = (UInt32)((ulong)((long)pUVar8 - (long)distances) >> 2);
      goto LAB_0018b6c5;
    }
  }
  else {
    uVar9 = 3;
    distances[uVar7 + 1] = uVar10 - 1;
    uVar7 = (ulong)((int)uVar7 + 2);
    uVar11 = uVar10;
  }
  UVar12 = (UInt32)uVar7;
  for (; lenLimit != uVar9; uVar9 = uVar9 + 1) {
    if (pbVar3[(ulong)uVar9 - (ulong)uVar11] != pbVar3[uVar9]) {
      distances[UVar12 - 2] = uVar9;
      goto LAB_0018b686;
    }
  }
  distances[UVar12 - 2] = lenLimit;
  SkipMatchesSpec(lenLimit,UVar6,p->pos,p->buffer,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                  p->cutValue);
LAB_0018b6c5:
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar6 = p->pos + 1;
  p->pos = UVar6;
  if (UVar6 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar12;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  GET_MATCHES_FOOTER(offset, maxLen)
}